

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

size_t next_pow2(size_t x)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = x - 1;
  if (x == 0) {
    uVar2 = uVar1;
  }
  for (; uVar2 != 0; uVar2 = uVar2 >> 1) {
    uVar1 = uVar1 + 1;
  }
  return 1L << ((byte)uVar1 & 0x3f);
}

Assistant:

size_t next_pow2(size_t x)
{
  int i = 0;
  x = x > 0 ? x - 1 : 0;
  while (x > 0)
  {
    x >>= 1;
    i++;
  }
  return ((size_t)1) << i;
}